

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::MultiVertexArrayOutputTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayOutputTests *this,Spec *spec)

{
  ostream *poVar1;
  InputType type;
  OutputType type_00;
  long lVar2;
  long lVar3;
  stringstream name;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  lVar3 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)(spec->arrays).
                                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(spec->arrays).
                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6); lVar2 = lVar2 + 1
      ) {
    poVar1 = std::operator<<(&local_1a8,"_");
    deqp::gls::Array::inputTypeToString_abi_cxx11_
              (&local_1d8,
               (Array *)(ulong)*(uint *)((long)&((spec->arrays).
                                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                inputType + lVar3),type);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)((long)&((spec->arrays).
                                                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               componentCount + lVar3));
    poVar1 = std::operator<<(poVar1,"_");
    deqp::gls::Array::outputTypeToString_abi_cxx11_
              (&local_1f8,
               (Array *)(ulong)*(uint *)((long)&((spec->arrays).
                                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                outputType + lVar3),type_00);
    std::operator<<(poVar1,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar3 = lVar3 + 0x40;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayOutputTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;

	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::inputTypeToString(spec.arrays[arrayNdx].inputType)
			<< spec.arrays[arrayNdx].componentCount << "_"
			<< Array::outputTypeToString(spec.arrays[arrayNdx].outputType);
	}

	return name.str();
}